

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O3

size_t priRMTest_deep(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = zmCreate_deep(n * 8);
  sVar2 = zmCreate_keep(n * 8);
  sVar3 = prngCOMBO_keep();
  sVar4 = qrPower_deep(n,n,sVar1);
  sVar1 = utilMax(2,sVar1,sVar4);
  return sVar1 + sVar3 + sVar2 + n * 0x10;
}

Assistant:

size_t priRMTest_deep(size_t n)
{
	size_t qr_deep = zmCreate_deep(O_OF_W(n));
	return O_OF_W(2 * n) + zmCreate_keep(O_OF_W(n)) + prngCOMBO_keep() +
		utilMax(2,
			qr_deep,
			qrPower_deep(n, n, qr_deep));
}